

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

bool __thiscall BackwardPass::DoTrackIntOverflow(BackwardPass *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  JITTimeFunctionBody *pJVar4;
  FunctionJITTimeInfo *pFVar5;
  
  pJVar4 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  uVar2 = JITTimeFunctionBody::GetSourceContextId(pJVar4);
  pFVar5 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  uVar3 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar5);
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,TrackIntUsagePhase,uVar2,uVar3);
  if (!bVar1) {
    pJVar4 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    uVar2 = JITTimeFunctionBody::GetSourceContextId(pJVar4);
    pFVar5 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    uVar3 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar5);
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,TrackIntOverflowPhase,uVar2,uVar3);
    if (bVar1) {
      return false;
    }
    if (this->tag != BackwardPhase) {
      return false;
    }
    if (this->currentPrePassLoop != (Loop *)0x0) {
      return false;
    }
    bVar1 = GlobOpt::DoLossyIntTypeSpec(this->globOpt);
    if (bVar1) {
      bVar1 = Func::IsJitInDebugMode(this->func);
      return !bVar1;
    }
  }
  return false;
}

Assistant:

bool
BackwardPass::DoTrackIntOverflow() const
{
    return
        !PHASE_OFF(Js::TrackIntUsagePhase, func) &&
        !PHASE_OFF(Js::TrackIntOverflowPhase, func) &&
        tag == Js::BackwardPhase &&
        !IsPrePass() &&
        globOpt->DoLossyIntTypeSpec() &&
        !func->IsJitInDebugMode();
}